

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O0

Vec_Int_t * Mio_SopVar1(int i)

{
  uint Entry;
  Vec_Int_t *p;
  Vec_Int_t *vSop;
  int i_local;
  
  p = Vec_IntAlloc(1);
  Entry = Mio_CubeVar1(i);
  Vec_IntPush(p,Entry);
  return p;
}

Assistant:

Vec_Int_t * Mio_SopVar1( int i )
{
    Vec_Int_t * vSop;
    vSop = Vec_IntAlloc( 1 );
    Vec_IntPush( vSop, Mio_CubeVar1(i) );
    return vSop;
}